

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void __thiscall pstore::stdout_logger::~stdout_logger(stdout_logger *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_file_logger).super_basic_logger.super_logger._vptr_logger =
       (_func_int **)&PTR__basic_logger_001379e0;
  pcVar1 = (this->super_file_logger).super_basic_logger.thread_name_._M_dataplus._M_p;
  paVar2 = &(this->super_file_logger).super_basic_logger.thread_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_file_logger).super_basic_logger.super_logger._vptr_logger =
       (_func_int **)&PTR__logger_00137a80;
  pcVar1 = (this->super_file_logger).super_basic_logger.super_logger.buffer_._M_dataplus._M_p;
  paVar2 = &(this->super_file_logger).super_basic_logger.super_logger.buffer_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

stdout_logger::~stdout_logger () noexcept = default;